

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O1

void __thiscall
aggreports::WriteExceedanceProbabilityTable
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
          *items,double max_retperiod,int epcalc,int eptype,int eptype_tvar,int samplesize)

{
  pointer *ppTVar1;
  iterator __position;
  double current_return_period;
  long lVar2;
  pointer pfVar3;
  pointer pfVar4;
  ulong uVar5;
  mapped_type *this_00;
  code *pcVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  long lVar9;
  long *plVar10;
  long lVar11;
  float fVar12;
  size_t nextreturnperiodindex;
  OASIS_FLOAT last_computed_loss;
  double last_computed_rp;
  pair<const_int,_std::vector<float,_std::allocator<float>_>_> s;
  map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  tail;
  float local_ec;
  pointer local_e0;
  float local_d4;
  vector<int,_std::allocator<int>_> *local_d0;
  undefined1 local_c8 [16];
  pointer local_b8;
  pointer local_b0;
  double local_a8;
  int local_9c;
  pointer local_98;
  _Rb_tree_color local_90 [2];
  vector<float,_std::allocator<float>_> local_88;
  _Base_ptr local_70;
  _Base_ptr local_68;
  _Rb_tree<int,_std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  local_60;
  
  if ((samplesize != 0) && ((items->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var7 = (items->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var8 = &(items->_M_t)._M_impl.super__Rb_tree_header;
    local_d0 = fileIDs;
    local_a8 = max_retperiod;
    local_9c = eptype_tvar;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var7 != p_Var8) {
      local_d4 = (float)samplesize;
      local_70 = &p_Var8->_M_header;
      do {
        local_90[0] = p_Var7[1]._M_color;
        local_68 = p_Var7;
        std::vector<float,_std::allocator<float>_>::vector
                  (&local_88,(vector<float,_std::allocator<float>_> *)&p_Var7[1]._M_parent);
        pfVar4 = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pfVar3 = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          local_c8._0_8_ =
               local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_e0 = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
          uVar5 = (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2;
          lVar9 = 0x3f;
          if (uVar5 != 0) {
            for (; uVar5 >> lVar9 == 0; lVar9 = lVar9 + -1) {
            }
          }
          std::
          __introsort_loop<std::reverse_iterator<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_c8,&local_e0,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
          local_b0 = pfVar4;
          local_b8 = pfVar3;
          std::
          __final_insertion_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (&local_b0,&local_b8);
        }
        pfVar4 = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pfVar3 = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_e0 = (pointer)0x0;
        local_b0 = (pointer)0x0;
        local_b8 = (pointer)((ulong)local_b8 & 0xffffffff00000000);
        if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          lVar9 = 1;
          local_ec = 0.0;
        }
        else {
          local_ec = 0.0;
          lVar9 = 1;
          lVar11 = 0;
          do {
            fVar12 = pfVar3[lVar9 + -1];
            if (this->useReturnPeriodFile_ == true) {
              fVar12 = fVar12 / local_d4;
              local_c8._0_8_ = this->WriteEPTOutput;
              local_c8._8_8_ = *(undefined8 *)&this->field_0x158;
              WriteReturnPeriodOut<std::map<int,std::vector<TVaR,std::allocator<TVaR>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                        (this,local_d0,(size_t *)&local_e0,(double *)&local_b0,
                         (OASIS_FLOAT *)&local_b8,local_a8 / (double)lVar9,fVar12,local_90[0],eptype
                         ,epcalc,local_a8,(int)lVar9,local_ec,
                         (map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                          *)&local_60,local_c8._0_8_,
                         (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                          *)local_c8._8_8_);
              local_ec = local_ec - (local_ec - fVar12) / (float)lVar9;
            }
            else {
              local_98 = (pointer)(local_a8 / (double)lVar9);
              this_00 = std::
                        map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                        ::operator[]((map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                                      *)&local_60,(key_type *)local_90);
              fVar12 = fVar12 / local_d4;
              local_ec = local_ec - (local_ec - fVar12) / (float)lVar9;
              local_c8._0_8_ = local_98;
              local_c8._8_4_ = local_ec;
              __position._M_current =
                   (this_00->super__Vector_base<TVaR,_std::allocator<TVaR>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this_00->super__Vector_base<TVaR,_std::allocator<TVaR>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<TVaR,_std::allocator<TVaR>_>::_M_realloc_insert<TVaR>
                          (this_00,__position,(TVaR *)local_c8);
              }
              else {
                (__position._M_current)->retperiod = (double)local_98;
                *(undefined8 *)&(__position._M_current)->tvar = local_c8._8_8_;
                ppTVar1 = &(this_00->super__Vector_base<TVaR,_std::allocator<TVaR>_>)._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppTVar1 = *ppTVar1 + 1;
              }
              pcVar6 = (code *)this->WriteEPTOutput;
              if (pcVar6 != (code *)0x0) {
                plVar10 = (long *)((long)&this->totalperiods_ + *(long *)&this->field_0x158);
                if (((ulong)pcVar6 & 1) != 0) {
                  pcVar6 = *(code **)(pcVar6 + *plVar10 + -1);
                }
                (*pcVar6)((int)local_98,fVar12,plVar10,local_d0,local_90[0],epcalc,eptype);
              }
            }
            lVar9 = lVar9 + 1;
            lVar2 = lVar11 + 4;
            lVar11 = lVar11 + 4;
          } while ((pointer)((long)pfVar3 + lVar2) != pfVar4);
        }
        if (this->useReturnPeriodFile_ == true) {
          do {
            current_return_period = 0.0;
            if (0 < (this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)local_e0]) {
              current_return_period = local_a8 / (double)lVar9;
            }
            local_c8._0_8_ = this->WriteEPTOutput;
            local_c8._8_8_ = *(undefined8 *)&this->field_0x158;
            WriteReturnPeriodOut<std::map<int,std::vector<TVaR,std::allocator<TVaR>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                      (this,local_d0,(size_t *)&local_e0,(double *)&local_b0,
                       (OASIS_FLOAT *)&local_b8,current_return_period,0.0,local_90[0],eptype,epcalc,
                       local_a8,(int)lVar9,local_ec,
                       (map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                        *)&local_60,local_c8._0_8_,
                       (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                        *)local_c8._8_8_);
            local_ec = local_ec - local_ec / (float)lVar9;
            lVar9 = lVar9 + 1;
          } while (local_e0 <
                   (pointer)((long)(this->returnperiods_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(this->returnperiods_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
        }
        if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_68);
      } while (p_Var7 != local_70);
    }
    if ((this->ordFlag_ != false) && (*this->fout_ != (FILE *)0x0)) {
      WriteTVaR(this,local_d0,epcalc,local_9c,
                (map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                 *)&local_60);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void aggreports::WriteExceedanceProbabilityTable(
	const std::vector<int> &fileIDs, std::map<int, lossvec> &items,
	const double max_retperiod, int epcalc, int eptype, int eptype_tvar,
	int samplesize) {

  if (items.size() == 0) return;
  if (samplesize == 0) return;

#ifdef ORD_OUTPUT
  if (os_ept_exists_ == false) {
  	if (parquetFileNames_[EPT] != "") {
		os_ept_ = GetParquetStreamWriter(EPT);
		os_ept_exists_ = true;
	}
  }
#endif

  std::map<int, std::vector<TVaR>> tail;

  for (auto s : items) {
    lossvec &lpv = s.second;
    std::sort(lpv.rbegin(), lpv.rend());
    size_t nextreturnperiodindex = 0;
    double last_computed_rp = 0;
    OASIS_FLOAT last_computed_loss = 0;
    OASIS_FLOAT tvar = 0;
    long i = 1;

    for (auto lp : lpv) {
      double retperiod = max_retperiod / i;

      if (useReturnPeriodFile_) {
#ifdef ORD_OUTPUT
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, lp / samplesize,
			     s.first, eptype, epcalc, max_retperiod, i, tvar,
			     tail, WriteEPTOutput, os_ept_);
#else
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, lp / samplesize,
			     s.first, eptype, epcalc, max_retperiod, i, tvar,
			     tail, WriteEPTOutput);
#endif
	tvar = tvar - ((tvar - (lp / samplesize)) / i);
      } else {
	tvar = tvar - ((tvar - (lp / samplesize)) / i);
	tail[s.first].push_back({retperiod, tvar});
	if (WriteEPTOutput != nullptr) {
	  (this->*WriteEPTOutput)(fileIDs, s.first, epcalc, eptype, retperiod,
				  lp / samplesize);
	}
#ifdef ORD_OUTPUT
	// TODO: Rather than checking for this on every iteration, it may be
	// more efficient to create a new class that inherits from
	// parquet::StreamWriter and implement the ios::setstate() function. In
	// this way, the state can be set to std::ios_base::badbit if needed.
	if (parquetFileNames_[EPT] != "") {
	  WriteParquetOutput(os_ept_, s.first, epcalc, eptype, retperiod,
			     lp / samplesize);
	}
#endif
      }
      i++;
    }
    if (useReturnPeriodFile_) {
      do {
	double retperiod = max_retperiod / i;
	if (returnperiods_[nextreturnperiodindex] <= 0) retperiod = 0;
#ifdef ORD_OUTPUT
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0, s.first, eptype,
			     epcalc, max_retperiod, i, tvar, tail,
			     WriteEPTOutput, os_ept_);
#else
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0, s.first, eptype,
			     epcalc, max_retperiod, i, tvar, tail,
			     WriteEPTOutput);
#endif
	tvar = tvar - (tvar / i);
	i++;
      } while (nextreturnperiodindex < returnperiods_.size());
    }
  }

  // Only write Tail Value at Risk (TVaR) for ORD output
  if (!ordFlag_) return;
  if (fout_[EPT] != nullptr) WriteTVaR(fileIDs, epcalc, eptype_tvar, tail);
#ifdef ORD_OUTPUT
  if (parquetFileNames_[EPT] != "") {
    WriteTVaR(os_ept_, epcalc, eptype_tvar, tail);
  }
#endif

}